

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O3

int hdr_log_write(hdr_log_writer *writer,FILE *file,hdr_timespec *start_timestamp,
                 hdr_timespec *end_timestamp,hdr_histogram *histogram)

{
  size_t input_len;
  uint uVar1;
  int iVar2;
  size_t output_len;
  char *output;
  int64_t iVar3;
  uint8_t *__ptr;
  double dVar4;
  uint8_t *compressed_histogram;
  size_t compressed_len;
  uint8_t *local_50;
  double local_48;
  FILE *local_40;
  size_t local_38;
  
  local_50 = (uint8_t *)0x0;
  local_38 = 0;
  uVar1 = hdr_encode_compressed(histogram,&local_50,&local_38);
  input_len = local_38;
  if (uVar1 == 0) {
    local_40 = (FILE *)file;
    output_len = hdr_base64_encoded_len(local_38);
    output = (char *)calloc(output_len + 1,1);
    __ptr = local_50;
    uVar1 = hdr_base64_encode(local_50,input_len,output,output_len);
    if (uVar1 == 0) {
      local_48 = hdr_timespec_as_double(start_timestamp);
      dVar4 = hdr_timespec_as_double(end_timestamp);
      iVar3 = hdr_max(histogram);
      iVar2 = fprintf(local_40,"%.3f,%.3f,%lu.0,%s\n",local_48,dVar4,iVar3,output);
      uVar1 = iVar2 >> 0x1f & 5;
    }
  }
  else {
    output = (char *)0x0;
    __ptr = local_50;
  }
  free(__ptr);
  free(output);
  return uVar1;
}

Assistant:

int hdr_log_write(
    struct hdr_log_writer* writer,
    FILE* file,
    const hdr_timespec* start_timestamp,
    const hdr_timespec* end_timestamp,
    struct hdr_histogram* histogram)
{
    uint8_t* compressed_histogram = NULL;
    size_t compressed_len = 0;
    char* encoded_histogram = NULL;
    int rc = 0;
    int result = 0;
    size_t encoded_len;

    (void)writer;

    rc = hdr_encode_compressed(histogram, &compressed_histogram, &compressed_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    encoded_len = hdr_base64_encoded_len(compressed_len);
    encoded_histogram = (char*) hdr_calloc(encoded_len + 1, sizeof(char));

    rc = hdr_base64_encode(
        compressed_histogram, compressed_len, encoded_histogram, encoded_len);
    if (rc != 0)
    {
        FAIL_AND_CLEANUP(cleanup, result, rc);
    }

    if (fprintf(
        file, "%.3f,%.3f,%" PRIu64 ".0,%s\n",
        hdr_timespec_as_double(start_timestamp),
        hdr_timespec_as_double(end_timestamp),
        hdr_max(histogram),
        encoded_histogram) < 0)
    {
        result = EIO;
    }

cleanup:
    hdr_free(compressed_histogram);
    hdr_free(encoded_histogram);

    return result;
}